

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::reserve
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          size_t capacity)

{
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar1;
  ulong uVar2;
  size_t sVar3;
  ulong in_RSI;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RDI;
  uint i;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *mem;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar4;
  
  if (in_RDI->_capacity < in_RSI) {
    pMVar1 = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             Lib::alloc(in_stack_ffffffffffffffd0);
    if (in_RDI->_stack == (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
      in_RDI->_stack = pMVar1;
      in_RDI->_cursor = pMVar1;
      in_RDI->_capacity = in_RSI;
      in_RDI->_end = in_RDI->_stack + in_RDI->_capacity;
    }
    else {
      uVar4 = 0;
      while( true ) {
        uVar2 = (ulong)uVar4;
        sVar3 = size(in_RDI);
        if (sVar3 <= uVar2) break;
        operator[](in_RDI,(ulong)uVar4);
        Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
                  ((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                   CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                   (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)in_RDI);
        uVar4 = uVar4 + 1;
      }
      Lib::free(in_RDI->_stack);
      in_RDI->_cursor = pMVar1 + ((long)in_RDI->_cursor - (long)in_RDI->_stack >> 5);
      in_RDI->_capacity = in_RSI;
      in_RDI->_stack = pMVar1;
      in_RDI->_end = in_RDI->_stack + in_RDI->_capacity;
    }
  }
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }